

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void add_zero_pad(double *X,int rows,int cols,int zrow,int zcol,double *Y)

{
  int iVar1;
  int iVar2;
  int v;
  int u;
  int j;
  int i;
  int c;
  int r;
  double *Y_local;
  int zcol_local;
  int zrow_local;
  int cols_local;
  int rows_local;
  double *X_local;
  
  iVar2 = cols + zcol;
  for (u = 0; iVar1 = rows, u < rows; u = u + 1) {
    for (v = 0; iVar1 = cols, v < cols; v = v + 1) {
      Y[u * iVar2 + v] = X[u * cols + v];
    }
    while (v = iVar1, v < iVar2) {
      Y[u * iVar2 + v] = 0.0;
      iVar1 = v + 1;
    }
  }
  while (u = iVar1, u < rows + zrow) {
    for (v = 0; v < iVar2; v = v + 1) {
      Y[u * iVar2 + v] = 0.0;
    }
    iVar1 = u + 1;
  }
  return;
}

Assistant:

void add_zero_pad(double *X, int rows, int cols, int zrow, int zcol,double *Y) {
	int r,c,i,j,u,v;
	r = rows + zrow;
	c = cols + zcol;
	
	for (i = 0; i < rows;++i) {
		u = i*c;
		v = i * cols;
		for (j = 0; j < cols;++j) {
			Y[u + j] = X[v + j];
		}
		for (j = cols; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
	for (i = rows; i < r;++i) {
		u = i*c;
		for(j = 0; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
}